

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_search_match_crossing_multiple_pages_Test::~Buffer_search_match_crossing_multiple_pages_Test
          (Buffer_search_match_crossing_multiple_pages_Test *this)

{
  Buffer_search_match_crossing_multiple_pages_Test *this_local;
  
  ~Buffer_search_match_crossing_multiple_pages_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, search_match_crossing_multiple_pages) {
    BufferWithReadonlyStrings local;

    size_t constexpr skip = 1;
    auto const needle = local.allstrs.substr(skip, std::size(local.allstrs)-(skip*2));
    auto pos = size_t {};

    EXPECT_EQ(0, bfy_buffer_search_all(&local.buf, std::data(needle), std::size(needle), &pos));
    EXPECT_EQ(skip, pos);
}